

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O3

void __thiscall DFsVariable::Serialize(DFsVariable *this,FArchive *ar)

{
  FArchive *pFVar1;
  
  DObject::Serialize(&this->super_DObject,ar);
  pFVar1 = FArchive::operator<<(ar,&this->Name);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->type);
  pFVar1 = FArchive::operator<<(pFVar1,&this->string);
  pFVar1 = FArchive::SerializeObject
                     (pFVar1,(DObject **)&this->actor,AActor::RegistrationInfo.MyClass);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&(this->value).handler);
  FArchive::SerializeObject(pFVar1,(DObject **)&this->next,RegistrationInfo.MyClass);
  return;
}

Assistant:

void DFsVariable::Serialize(FArchive & ar)
{
	Super::Serialize(ar);
	ar << Name << type << string << actor << value.i << next;
}